

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O1

FT_Bool Compute_Point_Displacement
                  (TT_ExecContext exc,FT_F26Dot6 *x,FT_F26Dot6 *y,TT_GlyphZone zone,FT_UShort *refp)

{
  FT_UShort **ppFVar1;
  FT_Vector **ppFVar2;
  ushort uVar3;
  FT_Short FVar4;
  ushort uVar5;
  FT_Memory pFVar6;
  FT_Vector *pFVar7;
  FT_Vector *pFVar8;
  FT_UShort *pFVar9;
  undefined8 uVar10;
  FT_Vector *pFVar11;
  FT_Byte *pFVar12;
  FT_Short FVar13;
  FT_Bool FVar14;
  FT_F26Dot6 a_;
  FT_Long FVar15;
  bool bVar16;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  bVar16 = (exc->opcode & 1) == 0;
  FVar13 = (&exc->zp0)[bVar16].max_contours;
  pFVar6 = (&exc->zp0)[bVar16].memory;
  uVar3 = (&exc->zp0)[bVar16].n_points;
  FVar4 = (&exc->zp0)[bVar16].n_contours;
  pFVar7 = (&exc->zp0)[bVar16].org;
  pFVar8 = (&exc->zp0)[bVar16].cur;
  ppFVar1 = &(&exc->zp0)[bVar16].contours;
  pFVar9 = *ppFVar1;
  uVar10 = ppFVar1[1];
  ppFVar2 = &(&exc->zp0)[bVar16].orus;
  pFVar11 = *ppFVar2;
  pFVar12 = (FT_Byte *)ppFVar2[1];
  uVar5 = (&((TT_GraphicsState *)(&exc->tt_metrics + 1))->rp1)[bVar16];
  if (uVar5 < uVar3) {
    zone->max_points = (&exc->zp0)[bVar16].max_points;
    zone->max_contours = FVar13;
    zone->memory = pFVar6;
    zone->n_points = uVar3;
    zone->n_contours = FVar4;
    zone->org = pFVar7;
    zone->cur = pFVar8;
    local_48 = SUB84(pFVar11,0);
    uStack_44 = (undefined4)((ulong)pFVar11 >> 0x20);
    uStack_40 = SUB84(pFVar12,0);
    uStack_3c = (undefined4)((ulong)pFVar12 >> 0x20);
    local_38 = SUB84(pFVar9,0);
    uStack_34 = (undefined4)((ulong)pFVar9 >> 0x20);
    uStack_30 = (undefined4)uVar10;
    uStack_2c = (undefined4)((ulong)uVar10 >> 0x20);
    *(undefined4 *)&zone->orus = local_48;
    *(undefined4 *)((long)&zone->orus + 4) = uStack_44;
    *(undefined4 *)&zone->tags = uStack_40;
    *(undefined4 *)((long)&zone->tags + 4) = uStack_3c;
    *(undefined4 *)&zone->contours = local_38;
    *(undefined4 *)((long)&zone->contours + 4) = uStack_34;
    *(undefined4 *)&zone->first_point = uStack_30;
    *(undefined4 *)&zone->field_0x3c = uStack_2c;
    *refp = uVar5;
    a_ = (*exc->func_project)
                   (exc,pFVar8[uVar5].x - pFVar7[uVar5].x,pFVar8[uVar5].y - pFVar7[uVar5].y);
    FVar15 = FT_MulDiv(a_,(long)(exc->GS).freeVector.x,exc->F_dot_P);
    *x = FVar15;
    FVar15 = FT_MulDiv(a_,(long)(exc->GS).freeVector.y,exc->F_dot_P);
    *y = FVar15;
    FVar14 = '\0';
  }
  else {
    if (exc->pedantic_hinting != '\0') {
      exc->error = 0x86;
    }
    *refp = 0;
    FVar14 = '\x01';
  }
  return FVar14;
}

Assistant:

static FT_Bool
  Compute_Point_Displacement( TT_ExecContext  exc,
                              FT_F26Dot6*     x,
                              FT_F26Dot6*     y,
                              TT_GlyphZone    zone,
                              FT_UShort*      refp )
  {
    TT_GlyphZoneRec  zp;
    FT_UShort        p;
    FT_F26Dot6       d;


    if ( exc->opcode & 1 )
    {
      zp = exc->zp0;
      p  = exc->GS.rp1;
    }
    else
    {
      zp = exc->zp1;
      p  = exc->GS.rp2;
    }

    if ( BOUNDS( p, zp.n_points ) )
    {
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Invalid_Reference );
      *refp = 0;
      return FAILURE;
    }

    *zone = zp;
    *refp = p;

    d = PROJECT( zp.cur + p, zp.org + p );

    *x = FT_MulDiv( d, (FT_Long)exc->GS.freeVector.x, exc->F_dot_P );
    *y = FT_MulDiv( d, (FT_Long)exc->GS.freeVector.y, exc->F_dot_P );

    return SUCCESS;
  }